

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O3

scalar __thiscall absl::make_unique<S2ClosestCellQuery,S2CellIndex*>(absl *this,S2CellIndex **args)

{
  S2CellIndex *pSVar1;
  double *pdVar2;
  S1ChordAngle local_30;
  double local_28;
  double local_20;
  
  pdVar2 = (double *)operator_new(0x270);
  pSVar1 = *args;
  S1ChordAngle::S1ChordAngle(&local_30,INFINITY);
  local_20 = local_30.length2_;
  S1ChordAngle::S1ChordAngle(&local_30,0.0);
  local_28 = local_30.length2_;
  S1ChordAngle::S1ChordAngle(&local_30,INFINITY);
  *pdVar2 = local_30.length2_;
  S1ChordAngle::S1ChordAngle(&local_30,0.0);
  pdVar2[1] = local_30.length2_;
  pdVar2[2] = 0.0;
  *(undefined4 *)(pdVar2 + 3) = 0x7fffffff;
  *(undefined1 *)((long)pdVar2 + 0x1c) = 0;
  S2ClosestCellQueryBase<S2MinDistance>::S2ClosestCellQueryBase
            ((S2ClosestCellQueryBase<S2MinDistance> *)(pdVar2 + 4));
  *pdVar2 = local_20;
  pdVar2[1] = local_28;
  pdVar2[2] = 0.0;
  *(undefined4 *)(pdVar2 + 3) = 0x7fffffff;
  *(undefined1 *)((long)pdVar2 + 0x1c) = 0;
  pdVar2[4] = (double)pSVar1;
  pdVar2[0x43] = (double)pSVar1;
  pdVar2[0x44] = 0.0;
  pdVar2[0x45] = -NAN;
  *(undefined4 *)(pdVar2 + 0x47) = 0xffffffff;
  if (pdVar2[9] != pdVar2[8]) {
    pdVar2[9] = pdVar2[8];
  }
  *(double **)this = pdVar2;
  return (__uniq_ptr_data<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>,_true,_true>)
         (__uniq_ptr_data<S2ClosestCellQuery,_std::default_delete<S2ClosestCellQuery>,_true,_true>)
         this;
}

Assistant:

typename memory_internal::MakeUniqueResult<T>::scalar make_unique(
    Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}